

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::benchmarkFailed(ConsoleReporter *this,StringRef error)

{
  ReusableStringStream *this_00;
  ColourImpl *pCVar1;
  TablePrinter *pTVar2;
  ColourGuard local_40;
  ColourGuard guard;
  StringRef error_local;
  
  error_local.m_size = error.m_size;
  error_local.m_start = error.m_start;
  pCVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  local_40.m_code = Red;
  local_40.m_engaged = true;
  local_40.m_colourImpl = pCVar1;
  (*pCVar1->_vptr_ColourImpl[2])(pCVar1,2);
  guard.m_code = Red;
  guard.m_engaged = true;
  local_40.m_engaged = false;
  guard.m_colourImpl = pCVar1;
  ColourImpl::ColourGuard::~ColourGuard(&local_40);
  pTVar2 = (this->m_tablePrinter).m_ptr;
  this_00 = &pTVar2->m_oss;
  ReusableStringStream::operator<<(this_00,(char (*) [19])"Benchmark failed (");
  ReusableStringStream::operator<<(this_00,&error_local);
  local_40.m_colourImpl = (ColourImpl *)CONCAT71(local_40.m_colourImpl._1_7_,0x29);
  ReusableStringStream::operator<<(this_00,(char *)&local_40);
  Catch::operator<<(pTVar2);
  Catch::operator<<(pTVar2);
  ColourImpl::ColourGuard::~ColourGuard(&guard);
  return;
}

Assistant:

void ConsoleReporter::benchmarkFailed( StringRef error ) {
    auto guard = m_colour->guardColour( Colour::Red ).engage( m_stream );
    (*m_tablePrinter)
        << "Benchmark failed (" << error << ')'
        << ColumnBreak() << RowBreak();
}